

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::IsPrepassSrcValueInfoPrecise
          (GlobOpt *this,Instr *instr,Value *src1Value,Value *src2Value,
          bool *isSafeToTransferInPrepass)

{
  bool bVar1;
  Opnd *pOVar2;
  bool local_3a;
  bool *isSafeToTransferInPrepass_local;
  Value *src2Value_local;
  Value *src1Value_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  pOVar2 = IR::Instr::GetSrc1(instr);
  if (pOVar2 != (Opnd *)0x0) {
    pOVar2 = IR::Instr::GetSrc1(instr);
    bVar1 = IsPrepassSrcValueInfoPrecise(this,pOVar2,src1Value,isSafeToTransferInPrepass);
    if (!bVar1) {
      return false;
    }
  }
  pOVar2 = IR::Instr::GetSrc2(instr);
  local_3a = true;
  if (pOVar2 != (Opnd *)0x0) {
    pOVar2 = IR::Instr::GetSrc2(instr);
    local_3a = IsPrepassSrcValueInfoPrecise(this,pOVar2,src2Value,isSafeToTransferInPrepass);
  }
  return local_3a;
}

Assistant:

bool
GlobOpt::IsPrepassSrcValueInfoPrecise(IR::Instr *const instr, Value *const src1Value, Value *const src2Value, bool * isSafeToTransferInPrepass) const
{
    return
        (!instr->GetSrc1() || IsPrepassSrcValueInfoPrecise(instr->GetSrc1(), src1Value, isSafeToTransferInPrepass)) &&
        (!instr->GetSrc2() || IsPrepassSrcValueInfoPrecise(instr->GetSrc2(), src2Value, isSafeToTransferInPrepass));
}